

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void tcp_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  pinger_t *pinger;
  undefined8 *puVar4;
  int *unaff_RBX;
  anon_union_232_2_629321f6_for_stream *paVar5;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in server_addr;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int *piStack_88;
  long lStack_58;
  code *pcStack_50;
  undefined8 local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pcStack_50 = (code *)0x1aef01;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_30);
  local_38 = (long)iVar1;
  local_40 = 0;
  if (local_38 == 0) {
    pcStack_50 = (code *)0x1aef2b;
    piVar2 = (int *)malloc(0x168);
    if (piVar2 == (int *)0x0) goto LAB_001aeff3;
    *piVar2 = vectored_writes;
    piVar2[1] = 0;
    piVar2[2] = 0;
    *(char **)(piVar2 + 0x58) = PING;
    pcStack_50 = (code *)0x1aef53;
    uVar3 = uv_default_loop();
    pcStack_50 = (code *)0x1aef62;
    iVar1 = uv_tcp_init(uVar3,piVar2 + 4);
    *(int **)(piVar2 + 4) = piVar2;
    local_38 = (long)iVar1;
    local_40 = 0;
    unaff_RBX = piVar2;
    if (local_38 != 0) goto LAB_001aeff8;
    unaff_RBX = piVar2 + 0x3e;
    pcStack_50 = (code *)0x1aef9c;
    iVar1 = uv_tcp_connect(unaff_RBX,piVar2 + 4,local_30,pinger_on_connect);
    local_38 = (long)iVar1;
    local_40 = 0;
    if (local_38 != 0) goto LAB_001af007;
    local_38 = (long)pinger_on_connect_count;
    local_40 = 0;
    if (local_38 == 0) {
      return;
    }
  }
  else {
    pcStack_50 = (code *)0x1aeff3;
    tcp_pinger_new_cold_1();
LAB_001aeff3:
    pcStack_50 = (code *)0x1aeff8;
    tcp_pinger_new_cold_5();
LAB_001aeff8:
    pcStack_50 = (code *)0x1af007;
    tcp_pinger_new_cold_2();
LAB_001af007:
    pcStack_50 = (code *)0x1af016;
    tcp_pinger_new_cold_3();
  }
  pcStack_50 = run_ping_pong_test;
  tcp_pinger_new_cold_4();
  pcStack_50 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  lStack_58 = 1;
  if (completed_pingers == 1) {
    unaff_RBX = (int *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    lStack_58 = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (lStack_58 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_ping_pong_test_cold_1();
  }
  iVar1 = (int)&lStack_58;
  run_ping_pong_test_cold_2();
  piStack_88 = unaff_RBX;
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    socketpair_pinger_new_cold_11();
LAB_001af2f1:
    socketpair_pinger_new_cold_1();
LAB_001af300:
    socketpair_pinger_new_cold_2();
LAB_001af30f:
    socketpair_pinger_new_cold_3();
LAB_001af31e:
    socketpair_pinger_new_cold_4();
LAB_001af32d:
    socketpair_pinger_new_cold_5();
LAB_001af33c:
    socketpair_pinger_new_cold_10();
LAB_001af341:
    socketpair_pinger_new_cold_6();
LAB_001af350:
    socketpair_pinger_new_cold_7();
  }
  else {
    pinger->vectored_writes = iVar1;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,&uStack_90,0x40,0x40);
    if (iVar1 != 0) goto LAB_001af2f1;
    iVar1 = uv_guess_handle(uStack_90);
    if (iVar1 != 7) goto LAB_001af300;
    iVar1 = uv_guess_handle(uStack_8c);
    if (iVar1 != 7) goto LAB_001af30f;
    uVar3 = uv_default_loop();
    paVar5 = &pinger->stream;
    iVar1 = uv_tcp_init(uVar3,paVar5);
    if (iVar1 != 0) goto LAB_001af31e;
    (pinger->stream).tcp.data = pinger;
    iVar1 = uv_tcp_open(paVar5,uStack_8c);
    if (iVar1 != 0) goto LAB_001af32d;
    puVar4 = (undefined8 *)malloc(0xd8);
    if (puVar4 == (undefined8 *)0x0) goto LAB_001af33c;
    *puVar4 = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar3,puVar4);
    if (iVar1 != 0) goto LAB_001af341;
    iVar1 = uv_tcp_open(puVar4,uStack_90);
    if (iVar1 != 0) goto LAB_001af350;
    pinger_write_ping(pinger);
    iVar1 = uv_read_start(paVar5,alloc_cb,pinger_read_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar4,alloc_cb,ponger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001af36e;
    }
  }
  socketpair_pinger_new_cold_8();
LAB_001af36e:
  socketpair_pinger_new_cold_9();
  tcp_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  socketpair_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void tcp_pinger_new(int vectored_writes) {
  int r;
  struct sockaddr_in server_addr;
  pinger_t* pinger;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT_OK(r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}